

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitDrop
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Drop *curr)

{
  bool bVar1;
  undefined1 local_68 [8];
  Flow value;
  Drop *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  value.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,curr->value);
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    Flow::Flow(__return_storage_ptr__);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitDrop(Drop* curr) {
    NOTE_ENTER("Drop");
    Flow value = visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    return Flow();
  }